

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_table.c
# Opt level: O2

void aom_film_grain_table_append
               (aom_film_grain_table_t *t,int64_t time_stamp,int64_t end_time,
               aom_film_grain_t *grain)

{
  int iVar1;
  aom_film_grain_table_entry_t *paVar2;
  
  paVar2 = t->tail;
  if ((paVar2 != (aom_film_grain_table_entry_t *)0x0) &&
     (iVar1 = bcmp(grain,paVar2,0x288), iVar1 == 0)) {
    if (end_time < paVar2->end_time) {
      end_time = paVar2->end_time;
    }
    paVar2->end_time = end_time;
    if (paVar2->start_time < time_stamp) {
      time_stamp = paVar2->start_time;
    }
    paVar2->start_time = time_stamp;
    return;
  }
  paVar2 = (aom_film_grain_table_entry_t *)aom_malloc(0x2a0);
  if (paVar2 == (aom_film_grain_table_entry_t *)0x0) {
    return;
  }
  memset(paVar2,0,0x2a0);
  if (t->tail != (aom_film_grain_table_entry_t *)0x0) {
    t->tail->next = paVar2;
  }
  if (t->head == (aom_film_grain_table_entry_t *)0x0) {
    t->head = paVar2;
  }
  t->tail = paVar2;
  paVar2->start_time = time_stamp;
  paVar2->end_time = end_time;
  memcpy(paVar2,grain,0x288);
  return;
}

Assistant:

void aom_film_grain_table_append(aom_film_grain_table_t *t, int64_t time_stamp,
                                 int64_t end_time,
                                 const aom_film_grain_t *grain) {
  if (!t->tail || memcmp(grain, &t->tail->params, sizeof(*grain))) {
    aom_film_grain_table_entry_t *new_tail = aom_malloc(sizeof(*new_tail));
    if (!new_tail) return;
    memset(new_tail, 0, sizeof(*new_tail));
    if (t->tail) t->tail->next = new_tail;
    if (!t->head) t->head = new_tail;
    t->tail = new_tail;

    new_tail->start_time = time_stamp;
    new_tail->end_time = end_time;
    new_tail->params = *grain;
  } else {
    t->tail->end_time = AOMMAX(t->tail->end_time, end_time);
    t->tail->start_time = AOMMIN(t->tail->start_time, time_stamp);
  }
}